

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::MergeReturnPass::BreakFromConstruct
          (MergeReturnPass *this,BasicBlock *block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order,
          Instruction *break_merge_inst)

{
  IRContext *pIVar1;
  iterator iVar2;
  pointer pOVar3;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  undefined8 uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  array<signed_char,_4UL> aVar8;
  uint32_t cond_id;
  uint32_t merge_id;
  uint32_t uVar9;
  Instruction *pIVar10;
  BasicBlock *pBVar11;
  Instruction **ppIVar12;
  const_iterator cVar13;
  ulong uVar14;
  Instruction *pIVar15;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var16;
  __hashtable *__h;
  uint uVar17;
  ulong uVar18;
  MergeReturnPass *this_01;
  MergeReturnPass *this_02;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar19;
  BasicBlock *old_body;
  BasicBlock *merge_block;
  uint32_t old_body_id;
  Bool bool_type;
  InstructionBuilder builder;
  BasicBlock *local_a0;
  uint32_t local_98;
  uint32_t local_94;
  undefined1 local_90 [16];
  PodType PStack_80;
  PodType PStack_7c;
  pointer local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_60;
  IRContext *local_58;
  BasicBlock *local_50;
  iterator local_48;
  Analysis local_40;
  iterator local_38;
  
  IRContext::InvalidateAnalyses((this->super_MemPass).super_Pass.context_,kAnalysisCFG);
  IRContext::BuildInvalidAnalyses((this->super_MemPass).super_Pass.context_,kAnalysisCFG);
  pIVar10 = BasicBlock::GetLoopMergeInst(block);
  if (pIVar10 != (Instruction *)0x0) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    pBVar11 = CFG::SplitLoopHeader
                        ((pIVar1->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,block);
    if (pBVar11 == (BasicBlock *)0x0) {
      return false;
    }
  }
  uVar6 = (break_merge_inst->has_result_id_ & 1) + 1;
  if (break_merge_inst->has_type_id_ == false) {
    uVar6 = (uint)break_merge_inst->has_result_id_;
  }
  uVar6 = Instruction::GetSingleWordOperand(break_merge_inst,uVar6);
  pBVar11 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar6);
  local_a0 = pBVar11;
  pIVar10 = BasicBlock::GetLoopMergeInst(pBVar11);
  if (pIVar10 != (Instruction *)0x0) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    CFG::SplitLoopHeader
              ((pIVar1->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,pBVar11);
  }
  local_68 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  ppIVar12 = (Instruction **)local_68;
  do {
    iVar2.node_ = *ppIVar12;
    ppIVar12 = &((iVar2.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while ((iVar2.node_)->opcode_ == OpPhi);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_60 = pBVar11;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  CFG::RemoveSuccessorEdges
            ((pIVar1->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,block);
  local_94 = Pass::TakeNextId((Pass *)this);
  local_38.node_ = iVar2.node_;
  pBVar11 = BasicBlock::SplitBasicBlock
                      (block,(this->super_MemPass).super_Pass.context_,local_94,
                       (iterator *)&stack0xffffffffffffffc8);
  local_90._0_8_ = predicated;
  std::
  _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
            ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)predicated);
  this_02 = (MergeReturnPass *)&this->return_blocks_;
  pIVar10 = (block->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar6 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_90._0_4_ = uVar6;
  this_01 = this_02;
  cVar13 = std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this_02,(key_type_conflict *)local_90);
  uVar4 = local_60;
  if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    local_90._0_8_ = this_02;
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_02,&local_94);
    this_01 = this_02;
  }
  if (break_merge_inst->opcode_ == OpLoopMerge) {
    uVar17 = (break_merge_inst->has_result_id_ & 1) + 1;
    if (break_merge_inst->has_type_id_ == false) {
      uVar17 = (uint)break_merge_inst->has_result_id_;
    }
    uVar6 = Instruction::GetSingleWordOperand(break_merge_inst,uVar17 + 1);
    this_01 = (MergeReturnPass *)
              (block->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar7 = 0;
    if (*(bool *)((long)&this_01->super_MemPass + 0x2d) == true) {
      uVar7 = Instruction::GetSingleWordOperand
                        ((Instruction *)this_01,
                         (uint)*(bool *)((long)&this_01->super_MemPass + 0x2c));
    }
    if (uVar6 == uVar7) {
      pIVar10 = (pBVar11->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      aVar8._M_elems[0] = '\0';
      aVar8._M_elems[1] = '\0';
      aVar8._M_elems[2] = '\0';
      aVar8._M_elems[3] = '\0';
      if (pIVar10->has_result_id_ == true) {
        aVar8._M_elems =
             (_Type)Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      local_78 = (pointer)&PStack_80;
      local_90._0_8_ = &PTR__SmallVector_003d7c78;
      _local_70 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      PStack_80.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar8._M_elems;
      local_90._8_8_ = (pointer)0x1;
      uVar14 = (ulong)(break_merge_inst->has_result_id_ & 1) + 1;
      if (break_merge_inst->has_type_id_ == false) {
        uVar14 = (ulong)break_merge_inst->has_result_id_;
      }
      uVar14 = uVar14 + 1;
      pOVar3 = (break_merge_inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar18 = ((long)(break_merge_inst->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
               -0x5555555555555555;
      if (uVar18 < uVar14 || uVar18 - uVar14 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      this_01 = (MergeReturnPass *)
                ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                (ulong)(uint)((int)uVar14 * 0x30));
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)this_01,
                 (SmallVector<unsigned_int,_2UL> *)local_90);
      local_90._0_8_ = &PTR__SmallVector_003d7c78;
      if (_local_70 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        this_01 = (MergeReturnPass *)&stack0xffffffffffffff90;
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   this_01,_local_70);
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        this_01 = (MergeReturnPass *)
                  (pIVar1->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        analysis::DefUseManager::UpdateDefUse((DefUseManager *)this_01,break_merge_inst);
      }
    }
  }
  InsertAfterElement(this_01,block,pBVar11,order);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  pIVar10 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_40 = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  local_90._8_8_ = (pointer)0x0;
  PStack_80.data._M_elems = (array<signed_char,_4UL>)0x0;
  PStack_7c.data._M_elems = (array<signed_char,_4UL>)0x0;
  local_78 = (pointer)0x0;
  local_70 = 1;
  local_90._0_8_ = &PTR__Type_003d8d10;
  local_58 = pIVar1;
  local_50 = block;
  local_48.node_ = pIVar10;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  uVar6 = analysis::TypeManager::GetId
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,(Type *)local_90);
  if (uVar6 != 0) {
    pIVar15 = this->return_flag_;
    cond_id = 0;
    uVar7 = 0;
    if (pIVar15->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
    }
    pIVar15 = InstructionBuilder::AddLoad
                        ((InstructionBuilder *)&stack0xffffffffffffffa8,uVar6,uVar7,0);
    if (pIVar15->has_result_id_ == true) {
      cond_id = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
    }
    this_00.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            *)(uVar4 + 8))->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    ;
    uVar7 = 0;
    uVar6 = 0;
    if (*(bool *)((long)this_00.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 0x2d) == true) {
      uVar6 = Instruction::GetSingleWordOperand
                        ((Instruction *)
                         this_00.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                         (uint)*(bool *)((long)this_00.
                                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                               .
                                               super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                               ._M_head_impl + 0x2c));
    }
    pIVar15 = (pBVar11->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    bVar5 = pIVar15->has_result_id_;
    if ((bool)bVar5 == true) {
      uVar7 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
      pIVar15 = (pBVar11->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      bVar5 = pIVar15->has_result_id_;
    }
    uVar9 = 0;
    merge_id = 0;
    if ((bVar5 & 1) != 0) {
      merge_id = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
    }
    InstructionBuilder::AddConditionalBranch
              ((InstructionBuilder *)&stack0xffffffffffffffa8,cond_id,uVar6,uVar7,merge_id,0);
    p_Var16 = &std::__detail::
               _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->new_edges_,&local_a0)->_M_t;
    pIVar15 = (block->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar15->has_result_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
    }
    local_98 = uVar9;
    pVar19 = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::_M_insert_unique<unsigned_int>(p_Var16,&local_98);
    if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      p_Var16 = &std::__detail::
                 _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->new_edges_,&local_a0)->_M_t;
      pIVar15 = (pBVar11->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar6 = 0;
      if (pIVar15->has_result_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
      }
      local_98 = uVar6;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(p_Var16,&local_98);
    }
    UpdatePhiNodes(this,block,local_a0);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    CFG::AddEdges((pIVar1->cfg_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                  .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,block);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    CFG::RegisterBlock((pIVar1->cfg_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                       .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,pBVar11);
    if ((pBVar11->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ !=
        &(pBVar11->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if (*(Instruction **)local_68 != pIVar10) {
        local_90._0_8_ = &PTR__Type_003d7f68;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)(local_90 + 8));
        return true;
      }
      __assert_fail("block->begin() != block->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x216,
                    "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                   );
    }
    __assert_fail("old_body->begin() != old_body->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x215,
                  "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                 );
  }
  __assert_fail("bool_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x1fe,
                "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
               );
}

Assistant:

bool MergeReturnPass::BreakFromConstruct(
    BasicBlock* block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order, Instruction* break_merge_inst) {
  // Make sure the CFG is build here.  If we don't then it becomes very hard
  // to know which new blocks need to be updated.
  context()->InvalidateAnalyses(IRContext::kAnalysisCFG);
  context()->BuildInvalidAnalyses(IRContext::kAnalysisCFG);

  // When predicating, be aware of whether this block is a header block, a
  // merge block or both.
  //
  // If this block is a merge block, ensure the appropriate header stays
  // up-to-date with any changes (i.e. points to the pre-header).
  //
  // If this block is a header block, predicate the entire structured
  // subgraph. This can act recursively.

  // If |block| is a loop header, then the back edge must jump to the original
  // code, not the new header.
  if (block->GetLoopMergeInst()) {
    if (cfg()->SplitLoopHeader(block) == nullptr) {
      return false;
    }
  }

  uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
  BasicBlock* merge_block = context()->get_instr_block(merge_block_id);
  if (merge_block->GetLoopMergeInst()) {
    cfg()->SplitLoopHeader(merge_block);
  }

  // Leave the phi instructions behind.
  auto iter = block->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  // Forget about the edges leaving block.  They will be removed.
  cfg()->RemoveSuccessorEdges(block);

  auto old_body_id = TakeNextId();
  BasicBlock* old_body = block->SplitBasicBlock(context(), old_body_id, iter);
  predicated->insert(old_body);

  // If a return block is being split, mark the new body block also as a return
  // block.
  if (return_blocks_.count(block->id())) {
    return_blocks_.insert(old_body_id);
  }

  // If |block| was a continue target for a loop |old_body| is now the correct
  // continue target.
  if (break_merge_inst->opcode() == spv::Op::OpLoopMerge &&
      break_merge_inst->GetSingleWordInOperand(1) == block->id()) {
    break_merge_inst->SetInOperand(1, {old_body->id()});
    context()->UpdateDefUse(break_merge_inst);
  }

  // Update |order| so old_block will be traversed.
  InsertAfterElement(block, old_body, order);

  // Within the new header we need the following:
  // 1. Load of the return status flag
  // 2. Branch to |merge_block| (true) or old body (false)
  // 3. Update OpPhi instructions in |merge_block|.
  // 4. Update the CFG.
  //
  // Since we are branching to the merge block of the current construct, there
  // is no need for an OpSelectionMerge.

  InstructionBuilder builder(
      context(), block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  // 1. Load of the return status flag
  analysis::Bool bool_type;
  uint32_t bool_id = context()->get_type_mgr()->GetId(&bool_type);
  assert(bool_id != 0);
  uint32_t load_id =
      builder.AddLoad(bool_id, return_flag_->result_id())->result_id();

  // 2. Branch to |merge_block| (true) or |old_body| (false)
  builder.AddConditionalBranch(load_id, merge_block->id(), old_body->id(),
                               old_body->id());

  if (!new_edges_[merge_block].insert(block->id()).second) {
    // It is possible that we already inserted a new edge to the merge block.
    // If so, that edge now goes from |old_body| to |merge_block|.
    new_edges_[merge_block].insert(old_body->id());
  }

  // 3. Update OpPhi instructions in |merge_block|.
  UpdatePhiNodes(block, merge_block);

  // 4. Update the CFG.  We do this after updating the OpPhi instructions
  // because |UpdatePhiNodes| assumes the edge from |block| has not been added
  // to the CFG yet.
  cfg()->AddEdges(block);
  cfg()->RegisterBlock(old_body);

  assert(old_body->begin() != old_body->end());
  assert(block->begin() != block->end());
  return true;
}